

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

int getEncodingIndex(char *name)

{
  int iVar1;
  int local_1c;
  int i;
  char *name_local;
  
  if (name == (char *)0x0) {
    name_local._4_4_ = 6;
  }
  else {
    for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
      iVar1 = streqci(name,getEncodingIndex::encodingNames[local_1c]);
      if (iVar1 != 0) {
        return local_1c;
      }
    }
    name_local._4_4_ = -1;
  }
  return name_local._4_4_;
}

Assistant:

static int FASTCALL
getEncodingIndex(const char *name) {
  static const char *const encodingNames[] = {
      KW_ISO_8859_1, KW_US_ASCII, KW_UTF_8, KW_UTF_16, KW_UTF_16BE, KW_UTF_16LE,
  };
  int i;
  if (name == NULL)
    return NO_ENC;
  for (i = 0; i < (int)(sizeof(encodingNames) / sizeof(encodingNames[0])); i++)
    if (streqci(name, encodingNames[i]))
      return i;
  return UNKNOWN_ENC;
}